

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O0

IPAddress * jaegertracing::net::IPAddress::v4(IPAddress *__return_storage_ptr__,string *hostPort)

{
  undefined1 local_38 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> result;
  string *hostPort_local;
  
  result._32_8_ = hostPort;
  parse((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)local_38,hostPort);
  v4(__return_storage_ptr__,(string *)local_38,result.first.field_2._8_4_);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static IPAddress v4(const std::string& hostPort)
    {
        auto result = parse(hostPort);
        return v4(result.first, result.second);
    }